

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

uint32_t __thiscall cfd::core::Transaction::GetTxInIndex(Transaction *this,Txid *txid,uint32_t vout)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this_00;
  long lVar3;
  pointer pTVar4;
  ulong uVar5;
  undefined1 local_50 [16];
  _func_int *local_40 [2];
  
  pTVar4 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      AbstractTxIn::GetTxid
                ((Txid *)local_50,
                 (AbstractTxIn *)((long)&(pTVar4->super_AbstractTxIn)._vptr_AbstractTxIn + lVar3));
      bVar1 = Txid::Equals((Txid *)local_50,txid);
      if (bVar1) {
        uVar2 = AbstractTxIn::GetVout
                          ((AbstractTxIn *)
                           ((long)&(((this->vin_).
                                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn)
                                   ._vptr_AbstractTxIn + lVar3));
        local_50._0_8_ = &PTR__Txid_00678d28;
        if ((void *)CONCAT44(local_50._12_4_,local_50._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_50._12_4_,local_50._8_4_));
        }
        if (uVar2 == vout) {
          return (uint32_t)uVar5;
        }
      }
      else {
        local_50._0_8_ = &PTR__Txid_00678d28;
        if ((void *)CONCAT44(local_50._12_4_,local_50._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_50._12_4_,local_50._8_4_));
        }
      }
      uVar5 = uVar5 + 1;
      pTVar4 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x90;
    } while (uVar5 < (ulong)(((long)(this->vin_).
                                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 4)
                            * -0x71c71c71c71c71c7));
  }
  local_50._0_8_ = "cfdcore_transaction.cpp";
  local_50._8_4_ = 0x201;
  local_40[0] = (_func_int *)0x585101;
  logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"Txid is not found.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Txid is not found.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::GetTxInIndex(const Txid &txid, uint32_t vout) const {
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == vout) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}